

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_on_write.h
# Opt level: O3

copy_on_write<DerivedType> *
make_copy_on_write<DerivedType,int&>(copy_on_write<DerivedType> *__return_storage_ptr__,int *ts)

{
  int iVar1;
  undefined4 extraout_var;
  element_type *peStack_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  _Head_base<0UL,_direct_shared_control_block<DerivedType,_DerivedType>_*,_false> local_20;
  
  peStack_30 = (element_type *)0x0;
  local_28 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_20._M_head_impl =
       (direct_shared_control_block<DerivedType,_DerivedType> *)operator_new(0x18);
  ((local_20._M_head_impl)->super_shared_control_block<DerivedType>)._vptr_shared_control_block =
       (_func_int **)&PTR__direct_shared_control_block_0018e550;
  iVar1 = *ts;
  ((local_20._M_head_impl)->u_).super_BaseType._vptr_BaseType = (_func_int **)&PTR_value_0018e3c8;
  DerivedType::object_count = DerivedType::object_count + 1;
  ((local_20._M_head_impl)->u_).value_ = iVar1;
  std::__shared_ptr<shared_control_block<DerivedType>,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<shared_control_block<DerivedType>,(__gnu_cxx::_Lock_policy)2> *)
             &peStack_30,
             (unique_ptr<direct_shared_control_block<DerivedType,_DerivedType>,_std::default_delete<direct_shared_control_block<DerivedType,_DerivedType>_>_>
              *)&local_20);
  if (local_20._M_head_impl != (direct_shared_control_block<DerivedType,_DerivedType> *)0x0) {
    (*((local_20._M_head_impl)->super_shared_control_block<DerivedType>)._vptr_shared_control_block
      [1])();
  }
  iVar1 = (*peStack_30->_vptr_shared_control_block[3])();
  __return_storage_ptr__->ptr_ = (DerivedType *)CONCAT44(extraout_var,iVar1);
  (__return_storage_ptr__->cb_).
  super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peStack_30;
  (__return_storage_ptr__->cb_).
  super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_28;
  return __return_storage_ptr__;
}

Assistant:

copy_on_write<T> make_copy_on_write(Ts&&... ts)
{
  copy_on_write<T> p;
  p.cb_ = std::make_unique<direct_shared_control_block<T>>(std::forward<Ts>(ts)...);
  p.ptr_ = p.cb_->ptr();
  return std::move(p);
}